

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poc-fec.c
# Opt level: O2

int poc_encoder(int sock,sockaddr_in *saddr,char *filename)

{
  mp3_frame_t *pmVar1;
  void *pvVar2;
  size_t __size;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  unsigned_short uVar7;
  int iVar8;
  fec_t *fec;
  adu_t *paVar9;
  unsigned_long uVar10;
  ulong uVar11;
  ulong uVar12;
  ssize_t sVar13;
  int *piVar14;
  gf **src;
  uint len;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  gf *__dest;
  uint uVar18;
  gf *pgVar19;
  long lVar20;
  char *__assertion;
  ulong uVar21;
  ulong uVar22;
  gf agStack_5fc0 [8];
  gf agStack_5fb8 [8];
  unsigned_long uStack_5fb0;
  ulong uStack_5fa8;
  ulong uStack_5fa0;
  gf *pgStack_5f98;
  undefined1 local_5f90 [8];
  mp3_frame_t mp3_frame;
  aq_t adu_queue;
  file_t mp3_file;
  timeval tv;
  unsigned_long local_a0;
  ulong local_98;
  ulong local_70;
  int local_44;
  uint local_34;
  
  uStack_5fa0 = 0x106654;
  iVar8 = file_open_read((file_t *)&adu_queue.size,filename);
  if (iVar8 == 0) {
    uStack_5fa0 = 0x106c28;
    fprintf(_stderr,"Could not open mp3 file: %s\n",filename);
    return 0;
  }
  uStack_5fa0 = 0x10666f;
  fec = fec_new((uint)fec_k,(uint)fec_n);
  uStack_5fa0 = 0x106682;
  aq_init((aq_t *)(mp3_frame.raw + 0xf98));
  lVar5 = -(ulong)((uint)fec_k * 8 + 0xf & 0xfffffff0);
  lVar6 = lVar5 + -0x5f98;
  *(undefined8 *)((long)&uStack_5fa0 + lVar5) = 0x1066b4;
  gettimeofday((timeval *)&mp3_file.pos,(__timezone_ptr_t)0x0);
  local_a0 = mp3_file.pos;
  *(undefined8 *)((long)&uStack_5fa0 + lVar5) = 1;
  local_44 = (int)*(undefined8 *)((long)&uStack_5fa0 + lVar5);
  local_98 = 0;
  local_70 = 0;
  do {
    local_34 = 0;
    do {
      do {
        *(undefined8 *)((long)&uStack_5fa0 + lVar5) = 0x106702;
        iVar8 = mp3_next_frame((file_t *)&adu_queue.size,(mp3_frame_t *)local_5f90);
        if ((iVar8 < 1) || ((finished & 1) != 0)) goto LAB_00106c45;
        *(undefined8 *)((long)&uStack_5fa0 + lVar5) = 0x106722;
        iVar8 = aq_add_frame((aq_t *)(mp3_frame.raw + 0xf98),(mp3_frame_t *)local_5f90);
      } while (iVar8 < 1);
      *(undefined8 *)((long)&uStack_5fa0 + lVar5) = 0x106731;
      paVar9 = aq_get_adu((aq_t *)(mp3_frame.raw + 0xf98));
      *(adu_t **)((long)&pgStack_5f98 + (ulong)local_34 * 8 + lVar6 + 0x5f98) = paVar9;
      if (paVar9 == (adu_t *)0x0) {
        __assertion = "in_adus[cnt] != NULL";
        *(undefined8 *)((long)&uStack_5fa0 + lVar5) = 0x68;
        goto LAB_00106cb3;
      }
      local_34 = local_34 + 1;
      uVar12 = (ulong)(uint)fec_k;
    } while (local_34 != fec_k);
    uVar21 = 0;
    uVar16 = 0;
    for (uVar22 = 0; len = (uint)uVar16, uVar22 < uVar12; uVar22 = uVar22 + 1) {
      pmVar1 = *(mp3_frame_t **)((long)&pgStack_5f98 + uVar22 * 8 + lVar6 + 0x5f98);
      *(undefined8 *)((long)&uStack_5fa0 + lVar5) = 0x106784;
      uVar10 = mp3_frame_size(pmVar1);
      uVar11 = uVar10 & 0xffffffff;
      if ((uint)uVar10 < len) {
        uVar11 = uVar16;
      }
      uVar21 = uVar21 + pmVar1->usec;
      uVar12 = (ulong)fec_k;
      uVar16 = uVar11;
    }
    if (0xfff0 < len) {
      __assertion = "max_len < FEC_PKT_PAYLOAD_SIZE";
      *(undefined8 *)((long)&uStack_5fa0 + lVar5) = 0x7b;
LAB_00106cb3:
      uVar4 = *(undefined8 *)((long)&uStack_5fa0 + lVar5);
      *(undefined8 *)((long)&uStack_5fa0 + lVar5) = 0x106cb9;
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/poc-fec.c",
                    (uint)uVar4,"int poc_encoder(int, struct sockaddr_in *, char *)");
    }
    local_70 = local_70 + uVar21;
    src = (gf **)((long)&pgStack_5f98 +
                 (lVar6 - (ulong)((int)uVar12 * 8 + 0xfU & 0xfffffff0)) + 0x5f98);
    uVar11 = (ulong)(uint)fec_k;
    pgVar19 = (gf *)((long)src - ((ulong)(fec_k * len) + 0xf & 0xfffffffffffffff0));
    uVar12 = 0;
    __dest = pgVar19;
    for (uVar22 = 0; uVar22 < uVar11; uVar22 = uVar22 + 1) {
      pmVar1 = *(mp3_frame_t **)((long)&pgStack_5f98 + uVar22 * 8 + lVar6 + 0x5f98);
      builtin_memcpy(pgVar19 + -8,"9h\x10",4);
      pgVar19[-4] = '\0';
      pgVar19[-3] = '\0';
      pgVar19[-2] = '\0';
      pgVar19[-1] = '\0';
      uVar10 = mp3_frame_size(pmVar1);
      src[uVar22] = __dest;
      builtin_memcpy(pgVar19 + -8,"`h\x10",4);
      pgVar19[-4] = '\0';
      pgVar19[-3] = '\0';
      pgVar19[-2] = '\0';
      pgVar19[-1] = '\0';
      memcpy(__dest,pmVar1->raw,uVar10 & 0xffffffff);
      uVar15 = len - (uint)uVar10;
      if ((uint)uVar10 <= len && uVar15 != 0) {
        builtin_memcpy(pgVar19 + -8,"vh\x10",4);
        pgVar19[-4] = '\0';
        pgVar19[-3] = '\0';
        pgVar19[-2] = '\0';
        pgVar19[-1] = '\0';
        memset(__dest + (uVar10 & 0xffffffff),0,(ulong)uVar15);
      }
      __dest = __dest + uVar16;
      uVar12 = uVar12 + pmVar1->bitrate;
      uVar11 = (ulong)fec_k;
    }
    for (uVar22 = 0; uVar22 < fec_n; uVar22 = uVar22 + 1) {
      pkt.hdr.packet_seq = (uchar)uVar22;
      pkt.hdr.fec_k = fec_k;
      pkt.hdr.fec_n = fec_n;
      builtin_memcpy(pgVar19 + -8,"/i\x10",4);
      pgVar19[-4] = '\0';
      pgVar19[-3] = '\0';
      pgVar19[-2] = '\0';
      pgVar19[-1] = '\0';
      pkt.hdr.fec_len = (unsigned_short)uVar16 + 2;
      pkt.hdr.group_tstamp = local_70;
      fec_encode(fec,src,pkt.payload,(uint)uVar22,len);
      uVar7 = (unsigned_short)uVar16;
      if (uVar22 < fec_k) {
        pmVar1 = *(mp3_frame_t **)((long)&pgStack_5f98 + uVar22 * 8 + lVar6 + 0x5f98);
        builtin_memcpy(pgVar19 + -8,"Ki\x10",4);
        pgVar19[-4] = '\0';
        pgVar19[-3] = '\0';
        pgVar19[-2] = '\0';
        pgVar19[-1] = '\0';
        uVar10 = mp3_frame_size(pmVar1);
        uVar7 = (unsigned_short)uVar10;
      }
      pgVar19[-8] = '\x10';
      pgVar19[-7] = '\0';
      pgVar19[-6] = '\0';
      pgVar19[-5] = '\0';
      pgVar19[-4] = '\0';
      pgVar19[-3] = '\0';
      pgVar19[-2] = '\0';
      pgVar19[-1] = '\0';
      builtin_memcpy(pgVar19 + -8,"ki\x10",4);
      pgVar19[-4] = '\0';
      pgVar19[-3] = '\0';
      pgVar19[-2] = '\0';
      pgVar19[-1] = '\0';
      pkt.hdr.len = uVar7;
      sVar13 = fec_pkt_sendto(&pkt,sock,(sockaddr *)saddr,(socklen_t)*(undefined8 *)(pgVar19 + -8));
      if (sVar13 < 0) {
        builtin_memcpy(pgVar19 + -8,"Aj\x10",4);
        pgVar19[-4] = '\0';
        pgVar19[-3] = '\0';
        pgVar19[-2] = '\0';
        pgVar19[-1] = '\0';
        piVar14 = __errno_location();
        if (*piVar14 != 0x69) {
          builtin_memcpy(pgVar19 + -8,"6l\x10",4);
          pgVar19[-4] = '\0';
          pgVar19[-3] = '\0';
          pgVar19[-2] = '\0';
          pgVar19[-1] = '\0';
          perror("Error while sending packet");
          local_44 = 0;
LAB_00106c45:
          for (uVar12 = 0; local_34 != uVar12; uVar12 = uVar12 + 1) {
            pvVar2 = *(void **)((long)&pgStack_5f98 + uVar12 * 8 + lVar6 + 0x5f98);
            *(undefined8 *)((long)&uStack_5fa0 + lVar5) = 0x106c5d;
            free(pvVar2);
          }
          *(undefined8 *)((long)&uStack_5fa0 + lVar5) = 0x106c6e;
          aq_destroy((aq_t *)(mp3_frame.raw + 0xf98));
          *(undefined8 *)((long)&uStack_5fa0 + lVar5) = 0x106c77;
          fec_free(fec);
          *(undefined8 *)((long)&uStack_5fa0 + lVar5) = 0x106c83;
          file_close((file_t *)&adu_queue.size);
          return local_44;
        }
        pgVar19[-8] = ' ';
        pgVar19[-7] = '\0';
        pgVar19[-6] = '\0';
        pgVar19[-5] = '\0';
        pgVar19[-4] = '\0';
        pgVar19[-3] = '\0';
        pgVar19[-2] = '\0';
        pgVar19[-1] = '\0';
        __size = *(size_t *)(pgVar19 + -8);
        pgVar19[-8] = '\x01';
        pgVar19[-7] = '\0';
        pgVar19[-6] = '\0';
        pgVar19[-5] = '\0';
        pgVar19[-4] = '\0';
        pgVar19[-3] = '\0';
        pgVar19[-2] = '\0';
        pgVar19[-1] = '\0';
        builtin_memcpy(pgVar19 + -8,"fj\x10",4);
        pgVar19[-4] = '\0';
        pgVar19[-3] = '\0';
        pgVar19[-2] = '\0';
        pgVar19[-1] = '\0';
        fwrite("Output buffers full, waiting...\n",__size,*(size_t *)(pgVar19 + -8),_stderr);
      }
      uVar17 = (ulong)fec_n;
      poc_encoder::wait_time = poc_encoder::wait_time + uVar21 / uVar17;
      if (1000 < poc_encoder::wait_time) {
        pgVar19[-8] = 0xa5;
        pgVar19[-7] = 'i';
        pgVar19[-6] = '\x10';
        pgVar19[-5] = '\0';
        pgVar19[-4] = '\0';
        pgVar19[-3] = '\0';
        pgVar19[-2] = '\0';
        pgVar19[-1] = '\0';
        usleep((__useconds_t)poc_encoder::wait_time);
      }
      local_98 = local_98 + uVar21 / uVar17;
      if (quiet == 0) {
        uVar15 = poc_encoder::count + 1;
        pgVar19[-8] = '\n';
        pgVar19[-7] = '\0';
        pgVar19[-6] = '\0';
        pgVar19[-5] = '\0';
        pgVar19[-4] = '\0';
        pgVar19[-3] = '\0';
        pgVar19[-2] = '\0';
        pgVar19[-1] = '\0';
        uVar17 = (ulong)poc_encoder::count;
        poc_encoder::count = uVar15;
        if ((int)(uVar17 % (*(ulong *)(pgVar19 + -8) & 0xffffffff)) == 0) {
          pgVar19[-8] = '<';
          pgVar19[-7] = '\0';
          pgVar19[-6] = '\0';
          pgVar19[-5] = '\0';
          pgVar19[-4] = '\0';
          pgVar19[-3] = '\0';
          pgVar19[-2] = '\0';
          pgVar19[-1] = '\0';
          uVar17 = (local_98 / 1000000) % *(ulong *)(pgVar19 + -8);
          if (mp3_file.offset == 0) {
            pgVar19[-8] = 0x83;
            pgVar19[-7] = 'j';
            pgVar19[-6] = '\x10';
            pgVar19[-5] = '\0';
            pgVar19[-4] = '\0';
            pgVar19[-3] = '\0';
            pgVar19[-2] = '\0';
            pgVar19[-1] = '\0';
            fprintf(_stdout,"\r%02ld:%02ld %ld %3ldkbit/s ",local_98 / 60000000,uVar17,
                    mp3_file._0_8_,uVar12 / uVar11);
          }
          else {
            lVar20 = (long)(((float)(local_70 / 1000) / ((float)(ulong)mp3_file._0_8_ + 1.0)) *
                           (float)mp3_file.offset);
            pgVar19[-8] = '<';
            pgVar19[-7] = '\0';
            pgVar19[-6] = '\0';
            pgVar19[-5] = '\0';
            pgVar19[-4] = '\0';
            pgVar19[-3] = '\0';
            pgVar19[-2] = '\0';
            pgVar19[-1] = '\0';
            lVar3 = *(long *)(pgVar19 + -8);
            *(long *)(pgVar19 + -8) =
                 (long)(((float)(ulong)mp3_file._0_8_ * 100.0) / (float)mp3_file.offset);
            *(ulong *)(pgVar19 + -0x10) = uVar12 / uVar11;
            *(unsigned_long *)(pgVar19 + -0x18) = mp3_file.offset;
            *(undefined8 *)(pgVar19 + -0x20) = mp3_file._0_8_;
            pgVar19[-0x28] = ';';
            pgVar19[-0x27] = 'k';
            pgVar19[-0x26] = '\x10';
            pgVar19[-0x25] = '\0';
            pgVar19[-0x24] = '\0';
            pgVar19[-0x23] = '\0';
            pgVar19[-0x22] = '\0';
            pgVar19[-0x21] = '\0';
            fprintf(_stdout,"\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld %3ldkbit/s (%3ld%%) ",
                    local_98 / 60000000,uVar17,lVar20 / 60000,(lVar20 / 1000) % lVar3);
          }
          builtin_memcpy(pgVar19 + -8,"Uk\x10",4);
          pgVar19[-4] = '\0';
          pgVar19[-3] = '\0';
          pgVar19[-2] = '\0';
          pgVar19[-1] = '\0';
          fflush(_stdout);
        }
      }
      builtin_memcpy(pgVar19 + -8,"ck\x10",4);
      pgVar19[-4] = '\0';
      pgVar19[-3] = '\0';
      pgVar19[-2] = '\0';
      pgVar19[-1] = '\0';
      gettimeofday((timeval *)&mp3_file.pos,(__timezone_ptr_t)0x0);
      poc_encoder::wait_time = (mp3_file.pos - local_a0) * -1000000 + poc_encoder::wait_time;
      uVar18 = (uint)poc_encoder::wait_time;
      uVar15 = -uVar18;
      if (0 < (int)uVar18) {
        uVar15 = uVar18;
      }
      if (1000000 < uVar15) {
        poc_encoder::wait_time = 0;
      }
      local_a0 = mp3_file.pos;
    }
    pkt.hdr.group_seq = pkt.hdr.group_seq + '\x01';
    for (uVar12 = 0; uVar12 < fec_k; uVar12 = uVar12 + 1) {
      pvVar2 = *(void **)((long)&pgStack_5f98 + uVar12 * 8 + lVar6 + 0x5f98);
      pgVar19[-8] = 0xf2;
      pgVar19[-7] = 'k';
      pgVar19[-6] = '\x10';
      pgVar19[-5] = '\0';
      pgVar19[-4] = '\0';
      pgVar19[-3] = '\0';
      pgVar19[-2] = '\0';
      pgVar19[-1] = '\0';
      free(pvVar2);
    }
  } while( true );
}

Assistant:

int poc_encoder(int sock, struct sockaddr_in *saddr, char *filename) {
  int retval = 1;
  
  /*M
    Open file for reading.
  **/
  file_t mp3_file;
  if (!file_open_read(&mp3_file, filename)) {
    fprintf(stderr, "Could not open mp3 file: %s\n", filename);
    return 0;
  }

  /*M
    Initialize the FEC parameters.
  **/
  fec_t *fec = fec_new(fec_k, fec_n);

  aq_t adu_queue;
  aq_init(&adu_queue);

  adu_t *in_adus[fec_k];
  unsigned int cnt = 0;

  static long wait_time = 0;
  unsigned long fec_time = 0;
  unsigned long fec_time2 = 0;

  /*M
    Get start time.
  **/
  struct timeval tv;
  gettimeofday(&tv, NULL);
  unsigned long start_sec, start_usec;
  start_sec = tv.tv_sec;
  start_usec = tv.tv_usec;
  
  /*M
    Get next MP3 frame and queue it into the ADU queue.
  **/
  mp3_frame_t mp3_frame;
  while ((mp3_next_frame(&mp3_file, &mp3_frame) > 0) && !finished) {
    if (aq_add_frame(&adu_queue, &mp3_frame) > 0) {
      /* a new ADU has been produced */
      in_adus[cnt] = aq_get_adu(&adu_queue);
      assert(in_adus[cnt] != NULL);

      /* check if the FEC group is complete */
      if (++cnt == fec_k) {
        unsigned int max_len = 0;
        unsigned long group_duration = 0;

        int i;
        for (i = 0; i < fec_k; i++) {
          unsigned int adu_len = mp3_frame_size(in_adus[i]);

          if (adu_len > max_len)
            max_len = adu_len;

          group_duration += in_adus[i]->usec;
        }

        fec_time += group_duration;

        assert(max_len < FEC_PKT_PAYLOAD_SIZE);

        /* Encode the FEC group */
        unsigned char *in_ptrs[fec_k];
        unsigned char buf[fec_k * max_len];
        unsigned char *ptr = buf;
        unsigned long bitrate = 0;
        for (i = 0; i < fec_k; i++) {
          unsigned int adu_len = mp3_frame_size(in_adus[i]);

          in_ptrs[i] = ptr;
          memcpy(ptr, in_adus[i]->raw, adu_len);
          if (adu_len < max_len)
            memset(ptr + adu_len, 0, max_len - adu_len);
          ptr += max_len;
          bitrate += in_adus[i]->bitrate;
        }
        bitrate /= fec_k;

        for (i = 0; i < fec_n; i++) {
          pkt.hdr.packet_seq = i;
          pkt.hdr.fec_k = fec_k;
          pkt.hdr.fec_n = fec_n;
          pkt.hdr.fec_len = max_len + 2;
          pkt.hdr.group_tstamp = fec_time;
          
          fec_encode(fec, in_ptrs, pkt.payload, i, max_len);

          if (i < fec_k) {
            pkt.hdr.len = mp3_frame_size(in_adus[i]);
          } else {
            pkt.hdr.len = max_len;
          }

          /*M
            Simulate packet loss.
          **/
#ifdef DEBUG_PLOSS
          if ((random() % 100) >= ploss_rate ) {
#endif /* DEBUG_PLOSS */

#ifdef DEBUG
            fprintf(stderr,
                    "sending fec packet group stamp %ld, gseq %d, pseq %d, size %d\n",
                    pkt.hdr.group_tstamp, pkt.hdr.group_seq, pkt.hdr.packet_seq, pkt.hdr.len);
#endif
            
            /* send rtp packet */
            if (fec_pkt_sendto(&pkt, sock, (struct sockaddr *)saddr, sizeof(*saddr)) < 0) {
              if (errno == ENOBUFS) {
		fprintf(stderr, "Output buffers full, waiting...\n");
	      } else {
                perror("Error while sending packet");
                
                retval = 0;
                goto exit;
              }
            }
#ifdef DEBUG_PLOSS
          }
#endif /* DEBUG_PLOSS */

          /*M
            Update the time we have to wait.
          **/
          wait_time += (group_duration / fec_n);
          fec_time2 += (group_duration / fec_n);

          /*M
            Sender synchronisation (\verb|sleep| until the next
            packet has to be sent.
          **/
          if (wait_time > 1000)
            usleep(wait_time);

          if (!quiet) {        
            static unsigned int count = 0;
            if ((count++ % 10) == 0) {
              if (mp3_file.size > 0) {
                fprintf(stdout,
                        "\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld %3ldkbit/s (%3ld%%) ",
                        (fec_time2/1000000) / 60,
                        (fec_time2/1000000) % 60,
                        
                        (long)((float)(fec_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                        60000,
                        (long)((float)(fec_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                        1000 % 60,
                        
                        mp3_file.offset,
                        mp3_file.size,

                        bitrate,
                        
                        (long)(100*(float)mp3_file.offset/(float)mp3_file.size));
              } else {
                fprintf(stdout, "\r%02ld:%02ld %ld %3ldkbit/s ",
                        (fec_time2/1000000) / 60,
                        (fec_time2/1000000) % 60,
                        mp3_file.offset,
                        bitrate);
              }
              fflush(stdout);
            }
          }
          
          /*M
            Get length of iteration.
          **/
          gettimeofday(&tv, NULL);
          unsigned long len =
            (tv.tv_sec - start_sec) * 1000000 + (tv.tv_usec - start_usec);
          
          wait_time -= len;
          if (abs(wait_time) > MAX_WAIT_TIME)
            wait_time = 0;

          start_sec = tv.tv_sec;
          start_usec = tv.tv_usec;
        }

        pkt.hdr.group_seq++;

        for (i = 0; i < fec_k; i++)
          free(in_adus[i]);

        cnt = 0;
      }
    }
  }

  int i;
 exit:
  for (i = 0; i < cnt; i++)
    free(in_adus[i]);
  
  aq_destroy(&adu_queue);
  fec_free(fec);

  file_close(&mp3_file);

  return retval;
}

/*M
  \emph{Print usage information.}
**/
static void usage(void) {
  fprintf(stderr,
          "Usage: ./poc-fec [-s address] [-p port] [-k fec_k] [-n fec_n] [-q] [-t ttl]");
#ifdef WITH_IPV6
  fprintf(stderr, " [-6]");
#endif /* WITH_IPV6 */
  fprintf(stderr, " files...\n");
  fprintf(stderr, "\t-s address : destination address (default 224.0.1.23 or ff02::4)\n");
  fprintf(stderr, "\t-p port    : destination port (default 1500)\n");
  fprintf(stderr, "\t-q         : quiet\n");
  fprintf(stderr, "\t-t ttl     : multicast ttl (default 1)\n");
  fprintf(stderr, "\t-k fec_k   : FEC k parameter (default 20)\n");
  fprintf(stderr, "\t-n fec_n   : FEC n parameter (default 25)\n");
#ifdef WITH_IPV6
  fprintf(stderr, "\t-6         : use ipv6\n");
#endif /* WITH_IPV6 */
}

/*M
  \emph{Main server routine.}

  Calls the mainloop for each filename given on the command line.
**/
int main(int argc, char *argv[]) {
  int retval = 0;

  char           *address = NULL;
  unsigned short port     = 1500;
  unsigned int   ttl      = 1;

  /*M
    Process the command line arguments.
  **/
  int c;
  while ((c = getopt(argc, argv, "hs:p:t:qP:k:n:"
#ifdef WITH_IPV6
                     "6"
#endif /* WITH_IPV6 */
                     )) >= 0) {
    switch (c) {
#ifdef WITH_IPV6
    case '6':
      use_ipv6 = 1;
      break;
#endif /* WITH_IPV6 */
      
    case 's':
      if (address != NULL)
        free(address);

      address = strdup(optarg);
      break;

    case 'p':
      port = (unsigned short)atoi(optarg);
      break;

    case 'q':
      quiet = 1;
      break;

    case 't':
      ttl = (unsigned int)atoi(optarg);
      break;

    case 'k':
      fec_k = (unsigned int)atoi(optarg);
      break;

    case 'n':
      fec_n = (unsigned int)atoi(optarg);
      break;
      
#ifdef DEBUG_PLOSS
    case 'P':
      {
        static struct timeval tv;
        gettimeofday(&tv, NULL);
        srandom(tv.tv_sec);
        ploss_rate = atoi(optarg);
        break;
      }
#endif /* DEBUG_PLOSS */

    case 'h':
    default:
      usage();
      retval = EXIT_FAILURE;
      goto exit;
    }
  }

  if (fec_n <= fec_k) {
    fprintf(stderr, "fec_n must be bigger than fec_k\n");
    retval = EXIT_FAILURE;
    goto exit;
  }

  if (optind == argc) {
    usage();
    retval = EXIT_FAILURE;
    goto exit;
  }

  if (address == NULL) {
#ifdef WITH_IPV6
    if (use_ipv6)
      address = strdup("ff02::4");
    else
      address = strdup("224.0.1.23");
#else
    address = strdup("224.0.1.23");
#endif /* WITH_IPV6 */
  }

  if (sig_set_handler(SIGINT, sig_int) == SIG_ERR) {
    retval = EXIT_FAILURE;
    goto exit;
  }

  /*M
    Open the sending socket.
  **/
  int sock;
  struct sockaddr_in saddr;
  if (!net_ip4_resolve_hostname(address, port, NULL, &saddr)) {
    fprintf(stderr, "Could not resolve %s\n", address);
    retval = EXIT_FAILURE;
    goto exit;
  }

  sock  = net_udp4_socket(&saddr, port, ttl);
  if (sock < 0) {
    fprintf(stderr, "Could not open socket\n");
    retval = EXIT_FAILURE;
    goto exit;
  }

  fec_pkt_init(&pkt);
  
  /*M
    Go through all files given on command line and stream them.
  **/
  int i;
  for (i = optind; (i < argc) && !finished; i++) {
    assert(argv[i] != NULL);
    char filename[MAX_FILENAME];
    strncpy(filename, argv[i], MAX_FILENAME - 1);
    filename[MAX_FILENAME - 1] = '\0';
    
    if (!poc_encoder(sock, &saddr, filename))
      continue;
  }
  
 exit:
  if (address != NULL)
    free(address);
  
  return retval;
}

/*M
 */